

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QImage>::moveAppend(QGenericArrayOps<QImage> *this,QImage *b,QImage *e)

{
  QImage *pQVar1;
  undefined8 uVar2;
  long lVar3;
  QPaintDevice *this_00;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QImage>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QImage>).size;
    do {
      this_00 = (QPaintDevice *)(pQVar1 + lVar3 * 0x18);
      QPaintDevice::QPaintDevice(this_00);
      *(undefined8 **)this_00 = &QImageIOPlugin::staticMetaObject;
      uVar2 = *(undefined8 *)(b + 0x10);
      *(undefined8 *)(b + 0x10) = 0;
      *(undefined8 *)(this_00 + 0x10) = uVar2;
      b = b + 0x18;
      lVar3 = (this->super_QArrayDataPointer<QImage>).size + 1;
      (this->super_QArrayDataPointer<QImage>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }